

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock_test.cpp
# Opt level: O2

pint p_test_case_prwlock_general_test(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  test_rwlock = (PRWLock *)p_rwlock_new();
  if (test_rwlock == (PRWLock *)0x0) {
    uVar6 = 0xa8;
  }
  else {
    is_threads_working = 1;
    writers_counter = 0;
    lVar2 = p_uthread_create(reader_thread_func,0,1,0);
    lVar3 = p_uthread_create(reader_thread_func,0,1,0);
    lVar4 = p_uthread_create(writer_thread_func,0,1,0);
    lVar5 = p_uthread_create(writer_thread_func,0,1,0);
    if (lVar2 == 0) {
      uVar6 = 0xc1;
    }
    else if (lVar3 == 0) {
      uVar6 = 0xc2;
    }
    else if (lVar4 == 0) {
      uVar6 = 0xc3;
    }
    else {
      if (lVar5 != 0) {
        p_uthread_sleep(10000);
        is_threads_working = 0;
        iVar1 = p_uthread_join(lVar2);
        if (iVar1 < 1) {
          printf("%s:%d: check failed\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
                 ,0xca);
          p_atomic_int_inc(&p_test_module_fail_counter);
        }
        iVar1 = p_uthread_join(lVar3);
        if (iVar1 < 1) {
          printf("%s:%d: check failed\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
                 ,0xcb);
          p_atomic_int_inc(&p_test_module_fail_counter);
        }
        iVar1 = p_uthread_join(lVar4);
        if (iVar1 < 1) {
          printf("%s:%d: check failed\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
                 ,0xcc);
          p_atomic_int_inc(&p_test_module_fail_counter);
        }
        iVar1 = p_uthread_join(lVar5);
        if (iVar1 < 1) {
          printf("%s:%d: check failed\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
                 ,0xcd);
          p_atomic_int_inc(&p_test_module_fail_counter);
        }
        p_uthread_unref(lVar2);
        p_uthread_unref(lVar3);
        p_uthread_unref(lVar4);
        p_uthread_unref(lVar5);
        p_rwlock_free(test_rwlock);
        p_libsys_shutdown();
        return -(uint)(p_test_module_fail_counter != 0);
      }
      uVar6 = 0xc4;
    }
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
         ,uVar6);
  exit(-1);
}

Assistant:

P_TEST_CASE_BEGIN (prwlock_general_test)
{
	p_libsys_init ();

	test_rwlock = p_rwlock_new ();

	P_TEST_REQUIRE (test_rwlock != NULL);

	is_threads_working = TRUE;
	writers_counter    = 0;

	PUThread *reader_thr1 = p_uthread_create ((PUThreadFunc) reader_thread_func,
						  NULL,
						  TRUE,
						  NULL);

	PUThread *reader_thr2 = p_uthread_create ((PUThreadFunc) reader_thread_func,
						  NULL,
						  TRUE,
						  NULL);

	PUThread *writer_thr1 = p_uthread_create ((PUThreadFunc) writer_thread_func,
						  NULL,
						  TRUE,
						  NULL);

	PUThread *writer_thr2 = p_uthread_create ((PUThreadFunc) writer_thread_func,
						  NULL,
						  TRUE,
						  NULL);

	P_TEST_REQUIRE (reader_thr1 != NULL);
	P_TEST_REQUIRE (reader_thr2 != NULL);
	P_TEST_REQUIRE (writer_thr1 != NULL);
	P_TEST_REQUIRE (writer_thr2 != NULL);

	p_uthread_sleep (10000);

	is_threads_working = FALSE;

	P_TEST_CHECK (p_uthread_join (reader_thr1) > 0);
	P_TEST_CHECK (p_uthread_join (reader_thr2) > 0);
	P_TEST_CHECK (p_uthread_join (writer_thr1) > 0);
	P_TEST_CHECK (p_uthread_join (writer_thr2) > 0);

	p_uthread_unref (reader_thr1);
	p_uthread_unref (reader_thr2);
	p_uthread_unref (writer_thr1);
	p_uthread_unref (writer_thr2);

	p_rwlock_free (test_rwlock);

	p_libsys_shutdown ();
}